

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UBool __thiscall
icu_63::ICUService::unregister(ICUService *this,URegistryKey rkey,UErrorCode *status)

{
  UBool UVar1;
  Mutex local_38;
  Mutex mutex;
  UBool result;
  ICUServiceFactory *factory;
  UErrorCode *status_local;
  URegistryKey rkey_local;
  ICUService *this_local;
  
  mutex.fMutex._7_1_ = '\0';
  if ((rkey != (URegistryKey)0x0) && (this->factories != (UVector *)0x0)) {
    Mutex::Mutex(&local_38,(UMutex *)icu_63::lock);
    UVar1 = UVector::removeElement(this->factories,rkey);
    if (UVar1 == '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      if (rkey != (URegistryKey)0x0) {
        (**(code **)(*rkey + 8))();
      }
    }
    else {
      (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])();
      mutex.fMutex._7_1_ = '\x01';
    }
    Mutex::~Mutex(&local_38);
  }
  if (mutex.fMutex._7_1_ != '\0') {
    (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])();
  }
  return mutex.fMutex._7_1_;
}

Assistant:

UBool 
ICUService::unregister(URegistryKey rkey, UErrorCode& status) 
{
    ICUServiceFactory *factory = (ICUServiceFactory*)rkey;
    UBool result = FALSE;
    if (factory != NULL && factories != NULL) {
        Mutex mutex(&lock);

        if (factories->removeElement(factory)) {
            clearCaches();
            result = TRUE;
        } else {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            delete factory;
        }
    }
    if (result) {
        notifyChanged();
    }
    return result;
}